

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMultiphysicsCompMesh.cpp
# Opt level: O3

void __thiscall
TPZMultiphysicsCompMesh::BuildMultiphysicsSpaceWithMemory
          (TPZMultiphysicsCompMesh *this,TPZVec<int> *active_approx_spaces,
          TPZVec<TPZCompMesh_*> *mesh_vector)

{
  TPZCreateApproximationSpace *this_00;
  TPZCompMesh **ppTVar1;
  ulong uVar2;
  int *piVar3;
  ulong uVar4;
  TPZCompEl **ppTVar5;
  long *plVar6;
  long lVar7;
  long nelem;
  TPZManVector<TPZCompMesh_*,_7> local_80;
  
  ppTVar1 = local_80.fExtAlloc;
  local_80.super_TPZVec<TPZCompMesh_*>.fStore = (TPZCompMesh **)0x0;
  local_80.super_TPZVec<TPZCompMesh_*>.fNElements = 0;
  local_80.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  local_80.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  uVar2 = active_approx_spaces->fNElements;
  if ((long)uVar2 < 6) {
    local_80.super_TPZVec<TPZCompMesh_*>.fStore = ppTVar1;
    if (0 < (long)uVar2) goto LAB_0114cbeb;
  }
  else {
    local_80.super_TPZVec<TPZCompMesh_*>.fStore =
         (TPZCompMesh **)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
    local_80.super_TPZVec<TPZCompMesh_*>.fNAlloc = uVar2;
LAB_0114cbeb:
    piVar3 = active_approx_spaces->fStore;
    uVar4 = 0;
    do {
      *(int *)((long)local_80.super_TPZVec<TPZCompMesh_*>.fStore + uVar4 * 4) = piVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  local_80.super_TPZVec<TPZCompMesh_*>.fNElements = uVar2;
  TPZManVector<int,_5>::operator=(&this->m_active_approx_spaces,(TPZManVector<int,_5> *)&local_80);
  if (local_80.super_TPZVec<TPZCompMesh_*>.fStore != ppTVar1) {
    local_80.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
    local_80.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_80.super_TPZVec<TPZCompMesh_*>.fStore != (TPZCompMesh **)0x0) {
      operator_delete__(local_80.super_TPZVec<TPZCompMesh_*>.fStore);
    }
  }
  local_80.super_TPZVec<TPZCompMesh_*>.fStore = (TPZCompMesh **)0x0;
  local_80.super_TPZVec<TPZCompMesh_*>.fNElements = 0;
  local_80.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  local_80.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01925ab8;
  uVar2 = mesh_vector->fNElements;
  if ((long)uVar2 < 8) {
    local_80.super_TPZVec<TPZCompMesh_*>.fStore = ppTVar1;
    if ((long)uVar2 < 1) goto LAB_0114ccc4;
  }
  else {
    local_80.super_TPZVec<TPZCompMesh_*>.fStore =
         (TPZCompMesh **)operator_new__(-(ulong)(uVar2 >> 0x3d != 0) | uVar2 * 8);
    local_80.super_TPZVec<TPZCompMesh_*>.fNAlloc = uVar2;
  }
  uVar4 = 0;
  do {
    local_80.super_TPZVec<TPZCompMesh_*>.fStore[uVar4] = mesh_vector->fStore[uVar4];
    uVar4 = uVar4 + 1;
  } while (uVar2 != uVar4);
LAB_0114ccc4:
  local_80.super_TPZVec<TPZCompMesh_*>.fNElements = uVar2;
  TPZManVector<TPZCompMesh_*,_7>::operator=(&this->m_mesh_vector,&local_80);
  if (local_80.super_TPZVec<TPZCompMesh_*>.fStore != ppTVar1) {
    local_80.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
    local_80.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018144b0;
    if (local_80.super_TPZVec<TPZCompMesh_*>.fStore != (TPZCompMesh **)0x0) {
      operator_delete__(local_80.super_TPZVec<TPZCompMesh_*>.fStore);
    }
  }
  lVar7 = (this->m_mesh_vector).super_TPZVec<TPZCompMesh_*>.fNElements;
  if (lVar7 == (this->m_active_approx_spaces).super_TPZVec<int>.fNElements) {
    (this->super_TPZCompMesh).fNmeshes = (long)(int)lVar7;
    TPZGeoMesh::ResetReference((this->super_TPZCompMesh).fReference);
    this_00 = &(this->super_TPZCompMesh).fCreate;
    TPZCreateApproximationSpace::SetAllCreateFunctionsMultiphysicElemWithMem(this_00);
    (this->super_TPZCompMesh).fCreate.fCreateWithMemory = true;
    CleanElementsConnects(this);
    TPZCreateApproximationSpace::BuildMesh(this_00,&this->super_TPZCompMesh);
    AddElements(this);
    AddConnects(this);
    LoadSolutionFromMeshes(this);
    lVar7 = (long)(int)(this->super_TPZCompMesh).fElementVec.super_TPZChunkVector<TPZCompEl_*,_10>.
                       fNElements;
    if (0 < lVar7) {
      nelem = 0;
      do {
        ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            (&(this->super_TPZCompMesh).fElementVec.
                              super_TPZChunkVector<TPZCompEl_*,_10>,nelem);
        if ((*ppTVar5 != (TPZCompEl *)0x0) &&
           (plVar6 = (long *)__dynamic_cast(*ppTVar5,&TPZCompEl::typeinfo,
                                            &TPZMultiphysicsElement::typeinfo,0),
           plVar6 != (long *)0x0)) {
          (**(code **)(*plVar6 + 0x168))(plVar6);
        }
        nelem = nelem + 1;
      } while (lVar7 != nelem);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "TPZMultiphysicsCompMesh:: The vector provided should have the same size.",0x48);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZMultiphysicsCompMesh.cpp"
             ,0x6d);
}

Assistant:

void TPZMultiphysicsCompMesh::BuildMultiphysicsSpaceWithMemory(TPZVec<int> & active_approx_spaces, TPZVec<TPZCompMesh * > & mesh_vector){
    m_active_approx_spaces = active_approx_spaces;
    m_mesh_vector          = mesh_vector;
    if (m_mesh_vector.size() != m_active_approx_spaces.size()) {
        std::cout<< "TPZMultiphysicsCompMesh:: The vector provided should have the same size." << std::endl;
        DebugStop();
    }
    
    int n_approx_spaces = m_mesh_vector.size();
    
    SetNMeshes(n_approx_spaces);
    Reference()->ResetReference();
    SetAllCreateFunctionsMultiphysicElemWithMem();
    ApproxSpace().CreateWithMemory(true);
    // delete all elements and connects in the mesh
    CleanElementsConnects();
    TPZCompMesh::AutoBuild();
    AddElements();
    AddConnects();
    LoadSolutionFromMeshes();
    
    int nel_res = NElements();
    for (long el = 0; el < nel_res; el++) {
        TPZCompEl *cel = Element(el);
        TPZMultiphysicsElement *mfcel = dynamic_cast<TPZMultiphysicsElement *>(cel);
        if (!mfcel) {
            continue;
        }
        mfcel->PrepareIntPtIndices();
    }
    
}